

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_Interval::Union(ON_Interval *this,ON_Interval *ain,ON_Interval *bin)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar2 = EmptyInterval.m_t[1];
  dVar7 = bin->m_t[0];
  dVar5 = bin->m_t[1];
  dVar4 = ain->m_t[0];
  if ((((dVar7 != -1.23432101234321e+308) || (NAN(dVar7))) || (dVar5 != -1.23432101234321e+308)) ||
     (NAN(dVar5))) {
    dVar1 = ain->m_t[1];
    if (((dVar4 != -1.23432101234321e+308) || (NAN(dVar4))) ||
       ((dVar1 != -1.23432101234321e+308 || (NAN(dVar1))))) {
      dVar8 = dVar4;
      if ((dVar1 < dVar4) && (dVar8 = dVar1, dVar4 < dVar1)) {
        dVar8 = ON_DBL_QNAN;
      }
      dVar9 = dVar7;
      if ((dVar5 < dVar7) && (dVar9 = dVar5, dVar7 < dVar5)) {
        dVar9 = ON_DBL_QNAN;
      }
      dVar8 = (double)(~-(ulong)(dVar8 <= dVar9) & (ulong)dVar9 |
                      (ulong)dVar8 & -(ulong)(dVar8 <= dVar9));
      dVar4 = (double)(~-(ulong)(!NAN(dVar4) && !NAN(dVar1)) & (ulong)ON_DBL_QNAN |
                      (~-(ulong)(dVar1 <= dVar4) & (ulong)dVar1 |
                      -(ulong)(dVar1 <= dVar4) & (ulong)dVar4) &
                      -(ulong)(!NAN(dVar4) && !NAN(dVar1)));
      dVar7 = (double)(~-(ulong)(!NAN(dVar7) && !NAN(dVar5)) & (ulong)ON_DBL_QNAN |
                      (~-(ulong)(dVar5 <= dVar7) & (ulong)dVar5 |
                      -(ulong)(dVar5 <= dVar7) & (ulong)dVar7) &
                      -(ulong)(!NAN(dVar7) && !NAN(dVar5)));
      uVar6 = -(ulong)(dVar7 <= dVar4);
      dVar7 = (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar4);
      if (dVar7 < dVar8) {
        this->m_t[0] = EmptyInterval.m_t[0];
        this->m_t[1] = dVar2;
        bVar3 = 0;
        goto LAB_0057874c;
      }
      this->m_t[0] = dVar8;
      this->m_t[1] = dVar7;
    }
    else {
      dVar4 = dVar7;
      if ((dVar5 < dVar7) && (dVar4 = dVar5, dVar7 < dVar5)) {
        dVar4 = ON_DBL_QNAN;
      }
      uVar6 = ~-(ulong)(!NAN(dVar7) && !NAN(dVar5)) & (ulong)ON_DBL_QNAN;
      this->m_t[0] = dVar4;
      this->m_t[1] = (double)(uVar6 | (~-(ulong)(dVar5 <= dVar7) & (ulong)dVar5 |
                                      -(ulong)(dVar5 <= dVar7) & (ulong)dVar7) &
                                      -(ulong)(!NAN(dVar7) && !NAN(dVar5)));
    }
    bVar3 = 1;
  }
  else {
    dVar7 = ain->m_t[1];
    dVar5 = dVar4;
    if ((dVar7 < dVar4) && (dVar5 = dVar7, dVar4 < dVar7)) {
      dVar5 = ON_DBL_QNAN;
    }
    dVar7 = (double)(~-(ulong)(!NAN(dVar4) && !NAN(dVar7)) & (ulong)ON_DBL_QNAN |
                    (~-(ulong)(dVar7 <= dVar4) & (ulong)dVar7 |
                    -(ulong)(dVar7 <= dVar4) & (ulong)dVar4) & -(ulong)(!NAN(dVar4) && !NAN(dVar7)))
    ;
    this->m_t[0] = dVar5;
    this->m_t[1] = dVar7;
    bVar3 = -(dVar5 != -1.23432101234321e+308) | -(dVar7 != -1.23432101234321e+308);
  }
LAB_0057874c:
  return (bool)(bVar3 & 1);
}

Assistant:

bool
ON_Interval::IsEmptyInterval() const
{
  return ( m_t[0] == ON_UNSET_VALUE && m_t[1] == ON_UNSET_VALUE ) ? true : false;
}